

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-common.c
# Opt level: O0

void init_and_get_number_of_frames(filename_list_node *fln,int *do_scan)

{
  int iVar1;
  undefined8 uVar2;
  _func_unsigned_long_input_handle_ptr *p_Var3;
  input_handle *piStack_30;
  int result;
  input_handle *ih;
  input_ops *ops;
  file_data *fd;
  int *do_scan_local;
  filename_list_node *fln_local;
  
  ih = (input_handle *)0x0;
  piStack_30 = (input_handle *)0x0;
  fd = (file_data *)do_scan;
  do_scan_local = (int *)fln;
  uVar2 = g_malloc(0x58);
  *(undefined8 *)(do_scan_local + 2) = uVar2;
  memcpy(*(void **)(do_scan_local + 2),&empty,0x58);
  ops = *(input_ops **)(do_scan_local + 2);
  iVar1 = open_plugin((char *)**(undefined8 **)do_scan_local,*(char **)(*(long *)do_scan_local + 8),
                      (input_ops **)&ih,&stack0xffffffffffffffd0);
  if (iVar1 == 0) {
    *(undefined4 *)&fd->st = 1;
    p_Var3 = (_func_unsigned_long_input_handle_ptr *)(**(code **)(ih + 0x40))(piStack_30);
    ops->get_samplerate = p_Var3;
    g_mutex_lock(&progress_mutex);
    total_frames = (guint64)(ops->get_samplerate + total_frames);
    g_cond_broadcast(&progress_cond);
    g_mutex_unlock(&progress_mutex);
    (**(code **)(ih + 0x58))(piStack_30);
  }
  if (piStack_30 != (input_handle *)0x0) {
    (**(code **)(ih + 0x20))(&stack0xffffffffffffffd0);
  }
  return;
}

Assistant:

void
init_and_get_number_of_frames(struct filename_list_node *fln, int *do_scan)
{
	struct file_data *fd;

	struct input_ops *ops = NULL;
	struct input_handle *ih = NULL;
	int result;

	fln->d = g_malloc(sizeof(struct file_data));
	memcpy(fln->d, &empty, sizeof empty);
	fd = (struct file_data *)fln->d;

	result = open_plugin(fln->fr->raw, fln->fr->display, &ops, &ih);
	if (result) {
		goto free;
	}

	*do_scan = TRUE;
	fd->number_of_frames = ops->get_total_frames(ih);
	g_mutex_lock(&progress_mutex);
	total_frames += fd->number_of_frames;
	g_cond_broadcast(&progress_cond);
	g_mutex_unlock(&progress_mutex);

free:
	if (!result) {
		ops->close_file(ih);
	}
	if (ih) {
		ops->handle_destroy(&ih);
	}
}